

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertHandlerShouldNotBeCalled_Test::
~AssertionTest_assertHandlerShouldNotBeCalled_Test
          (AssertionTest_assertHandlerShouldNotBeCalled_Test *this)

{
  AssertionTest_assertHandlerShouldNotBeCalled_Test *this_local;
  
  ~AssertionTest_assertHandlerShouldNotBeCalled_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(AssertionTest, assertHandlerShouldNotBeCalled)
{
    std::int32_t a = 0;
    std::int32_t b = 1;
    CPP_ASSERT(a!=b);
    EXPECT_EQ(0, assertionHandlerCounter_);
    CPP_ASSERT(a!=b, "");
    EXPECT_EQ(0, assertionHandlerCounter_);
}